

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
     PrintValue<wasm::Struct,void,std::ostream&>(Struct *value,ostream *os)

{
  Struct SVar1;
  undefined8 in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  pointer in_stack_ffffffffffffffd8;
  pointer local_20;
  
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffffd0,
             &value->fields);
  SVar1.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = in_stack_ffffffffffffffd0;
  SVar1.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffffc8;
  SVar1.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffd8;
  wasm::operator<<(os,SVar1);
  if (in_stack_ffffffffffffffd0 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffffd0,(long)local_20 - (long)in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

static void PrintValue(const T& value, ::std::ostream* os) {
    // Call streaming operator found by ADL, possibly with implicit conversions
    // of the arguments.
    *os << value;
  }